

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_shader.h
# Opt level: O1

GLuint s_loadShader(GLenum type,char *source)

{
  GLuint GVar1;
  GLint compiled;
  char *local_28;
  int local_1c;
  
  local_28 = source;
  GVar1 = (*glad_glCreateShader)(type);
  if (GVar1 == 0) {
    s_loadShader();
    GVar1 = 0;
  }
  else {
    (*glad_glShaderSource)(GVar1,1,&local_28,(GLint *)0x0);
    (*glad_glCompileShader)(GVar1);
    (*glad_glGetShaderiv)(GVar1,0x8b81,&local_1c);
    if (local_1c == 0) {
      s_loadShader();
      GVar1 = 0;
    }
  }
  return GVar1;
}

Assistant:

static GLuint s_loadShader(GLenum type, const char *source)
{
	GLuint shader = glCreateShader(type);
	if (shader == 0)
	{
		fprintf(stderr, "Could not create shader!\n");
		return 0;
	}
	glShaderSource(shader, 1, &source, NULL);
	glCompileShader(shader);
	GLint compiled;
	glGetShaderiv(shader, GL_COMPILE_STATUS, &compiled);
	if (!compiled)
	{
		fprintf(stderr, "Could not compile shader!\n");
		GLint infoLen = 0;
		glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &infoLen);
		if (infoLen)
		{
			char* infoLog = (char*)malloc(infoLen);
			glGetShaderInfoLog(shader, infoLen, NULL, infoLog);
			fprintf(stderr, "%s\n", infoLog);
			free(infoLog);
		}
		glDeleteShader(shader);
		return 0;
	}
	return shader;
}